

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileSwitch(jx9_gen_state *pGen)

{
  sxu32 sVar1;
  uint uVar2;
  jx9_vm *pVm;
  GenBlock *pBlock;
  int iVar3;
  sxi32 sVar4;
  long lVar5;
  SySet *pSet;
  ulong uVar6;
  SyToken *pSVar7;
  SyToken *pSVar8;
  SyToken *pSVar9;
  SyToken *pSVar10;
  sxu32 *pBlockStart;
  char cVar11;
  GenBlock *pSwitchBlock;
  GenBlock *local_68;
  jx9_case_expr local_60;
  
  pSVar8 = pGen->pIn;
  sVar1 = pSVar8->nLine;
  pGen->pIn = pSVar8 + 1;
  if ((pGen->pEnd <= pSVar8 + 1) || ((pSVar8[1].nType & 0x200) == 0)) {
    iVar3 = jx9GenCompileError(pGen,1,sVar1,"Expected \'(\' after \'switch\' keyword");
    goto LAB_00126a8a;
  }
  pGen->pIn = pSVar8 + 2;
  sVar4 = GenStateEnterBlock(pGen,0x101,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&local_68);
  if (sVar4 != 0) {
    return -10;
  }
  pSVar8 = pGen->pIn;
  pSVar10 = pGen->pEnd;
  if (pSVar8 < pSVar10) {
    iVar3 = 1;
    lVar5 = 0;
    do {
      uVar2 = *(uint *)((long)&pSVar8->nType + lVar5);
      if ((uVar2 >> 9 & 1) == 0) {
        if ((uVar2 >> 10 & 1) != 0) {
          if (iVar3 < 2) {
            if (lVar5 == 0) goto LAB_00126b5c;
            break;
          }
          iVar3 = iVar3 + -1;
        }
      }
      else {
        iVar3 = iVar3 + 1;
      }
      pSVar7 = (SyToken *)((long)&pSVar8[1].sData.zString + lVar5);
      lVar5 = lVar5 + 0x20;
    } while (pSVar7 < pSVar10);
    pSVar8 = (SyToken *)((long)&(pSVar8->sData).zString + lVar5);
    if (pSVar10 <= pSVar8) goto LAB_00126b5c;
  }
  else {
LAB_00126b5c:
    sVar4 = jx9GenCompileError(pGen,1,sVar1,"Expected expression after \'switch\' keyword");
    if (sVar4 == -10) {
      return -10;
    }
    pSVar10 = pGen->pEnd;
  }
  pGen->pEnd = pSVar8;
  sVar4 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  if (sVar4 == -10) {
    return -10;
  }
  pSVar7 = pGen->pIn;
  while (pSVar7 < pSVar8) {
    sVar4 = jx9GenCompileError(pGen,1,pSVar7->nLine,"Switch: Unexpected token \'%z\'");
    if (sVar4 == -10) {
      return -10;
    }
    pSVar7 = pGen->pIn + 1;
    pGen->pIn = pSVar7;
  }
  pSVar7 = pSVar8 + 1;
  pGen->pIn = pSVar7;
  pGen->pEnd = pSVar10;
  pSVar9 = pSVar8;
  if (((pSVar7 < pSVar10) && (pSVar9 = pSVar7, pSVar8 + 2 < pSVar10)) &&
     ((pSVar8[1].nType & 0x100040) != 0)) {
    pGen->pIn = pSVar8 + 2;
    pSet = (SySet *)SyMemBackendAlloc(&pGen->pVm->sAllocator,0x30);
    if (pSet == (SySet *)0x0) {
      jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
      return -10;
    }
    uVar6 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&pSet->pAllocator + uVar6 + 4) = 0;
      uVar6 = uVar6 + 4;
    } while (uVar6 < 0x2c);
    pVm = pGen->pVm;
    pSet->nUsed = 0;
    pSet->nSize = 0;
    pSet->eSize = 0x30;
    pSet->nCursor = 0;
    pSet->pAllocator = &pVm->sAllocator;
    pSet->pBase = (void *)0x0;
    pSet->pUserData = (void *)0x0;
    jx9VmEmitInstr(pVm,0x45,0,0,pSet,(sxu32 *)0x0);
    pBlockStart = (sxu32 *)((long)&pSet[1].pAllocator + 4);
    do {
      pSVar8 = pGen->pIn;
      if (pGen->pEnd <= pSVar8) goto LAB_00126e36;
      if ((pSVar8->nType & 4) == 0) {
        if (-1 < (char)pSVar8->nType) {
LAB_00126e13:
          sVar4 = jx9GenCompileError(pGen,1,pSVar8->nLine,"Switch: Unexpected token \'%z\'");
          if (sVar4 == -10) {
            return -10;
          }
        }
        goto LAB_00126e36;
      }
      if (*(int *)&pSVar8->pUserData == 5) {
        pGen->pIn = pSVar8 + 1;
        local_60.aByteCode.pAllocator = &pGen->pVm->sAllocator;
        local_60.aByteCode.nUsed = 0;
        local_60.aByteCode.nSize = 0;
        local_60.aByteCode.eSize = 0x18;
        local_60.aByteCode.nCursor = 0;
        local_60.aByteCode.pBase = (void *)0x0;
        local_60.aByteCode.pUserData = (void *)0x0;
        sVar4 = GenStateCompileCaseExpr(pGen,&local_60);
        cVar11 = '\x01';
        if (sVar4 != -10) {
          sVar4 = GenStateCompileSwitchBlock(pGen,&local_60.nStart);
          SySetPut(pSet,&local_60);
          if (sVar4 != -10) {
            if (sVar4 == -0x12) {
              cVar11 = '\x05';
            }
            else {
              cVar11 = '\0';
            }
          }
        }
      }
      else {
        if (*(int *)&pSVar8->pUserData != 10) goto LAB_00126e13;
        if (*pBlockStart != 0) {
          sVar4 = jx9GenCompileError(pGen,2,pSVar8->nLine,
                                     "Switch: \'default\' case already compiled");
          if (sVar4 == -10) {
            return -10;
          }
          pSVar8 = pGen->pIn;
        }
        pGen->pIn = pSVar8 + 1;
        sVar4 = GenStateCompileSwitchBlock(pGen,pBlockStart);
        if (sVar4 == -10) {
          return -10;
        }
        cVar11 = (sVar4 == -0x12) * '\x05';
      }
    } while (cVar11 == '\0');
    if (cVar11 != '\x05') {
      return -10;
    }
LAB_00126e36:
    sVar1 = pGen->pVm->pByteContainer->nUsed;
    *(sxu32 *)&pSet[1].pAllocator = sVar1;
    GenStateFixJumps(local_68,-1,sVar1);
    pBlock = pGen->pCurrent;
    if (pBlock != (GenBlock *)0x0) {
      pGen->pCurrent = pBlock->pParent;
      GenStateFreeBlock(pBlock);
    }
    if (pGen->pEnd <= pGen->pIn) {
      return 0;
    }
    pGen->pIn = pGen->pIn + 1;
    return 0;
  }
  iVar3 = jx9GenCompileError(pGen,1,pSVar9->nLine,"Switch: Unexpected token \'%z\'");
LAB_00126a8a:
  sVar4 = -10;
  if (iVar3 != -10) {
    pSVar8 = pGen->pIn;
    while ((sVar4 = 0, pSVar8 < pGen->pEnd && (sVar4 = 0, (pSVar8->nType & 0x40000) == 0))) {
      pGen->pIn = pSVar8 + 1;
      pSVar8 = pSVar8 + 1;
    }
  }
  return sVar4;
}

Assistant:

static sxi32 jx9CompileSwitch(jx9_gen_state *pGen)
{
	GenBlock *pSwitchBlock;
	SyToken *pTmp, *pEnd;
	jx9_switch *pSwitch;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'switch' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'switch' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	pEnd = 0; /* cc warning */
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP|GEN_BLOCK_SWITCH, 
		jx9VmInstrLength(pGen->pVm), 0, &pSwitchBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the condition */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected expression after 'switch' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, 
			"Switch: Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pGen->pIn  = &pEnd[1];
	pGen->pEnd = pTmp;
	if( pGen->pIn >= pGen->pEnd || &pGen->pIn[1] >= pGen->pEnd ||
		(pGen->pIn->nType & (JX9_TK_OCB/*'{'*/|JX9_TK_COLON/*:*/)) == 0 ){
			pTmp = pGen->pIn;
			if( pTmp >= pGen->pEnd ){
				pTmp--;
			}
			/* Unexpected token */
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pTmp->nLine, "Switch: Unexpected token '%z'", &pTmp->sData);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			goto Synchronize;
	}
	pGen->pIn++; /* Jump the leading curly braces/colons */
	/* Create the switch blocks container */
	pSwitch = (jx9_switch *)SyMemBackendAlloc(&pGen->pVm->sAllocator, sizeof(jx9_switch));
	if( pSwitch == 0 ){
		/* Abort compilation */
		return GenStateOutOfMem(pGen);
	}
	/* Zero the structure */
	SyZero(pSwitch, sizeof(jx9_switch));
	/* Initialize fields */
	SySetInit(&pSwitch->aCaseExpr, &pGen->pVm->sAllocator, sizeof(jx9_case_expr));
	/* Emit the switch instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_SWITCH, 0, 0, pSwitch, 0);
	/* Compile case blocks */
	for(;;){
		sxu32 nKwrd;
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		if( (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			if(  (pGen->pIn->nType & JX9_TK_CCB /*}*/) == 0 ){
				/* Unexpected token */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Switch: Unexpected token '%z'", 
					&pGen->pIn->sData);
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				/* FALL THROUGH */
			}
			/* Block compiled */
			break;
		}
		/* Extract the keyword */
		nKwrd = SX_PTR_TO_INT(pGen->pIn->pUserData);
		if( nKwrd == JX9_TKWRD_DEFAULT ){
			/*
			 * Accroding to the JX9 language reference manual
			 *  A special case is the default case. This case matches anything
			 *  that wasn't matched by the other cases.
			 */
			if( pSwitch->nDefault > 0 ){
				/* Default case already compiled */ 
				rc = jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Switch: 'default' case already compiled");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
			}
			pGen->pIn++; /* Jump the 'default' keyword */
			/* Compile the default block */
			rc = GenStateCompileSwitchBlock(pGen,&pSwitch->nDefault);
			if( rc == SXERR_ABORT){
				return SXERR_ABORT;
			}else if( rc == SXERR_EOF ){
				break;
			}
		}else if( nKwrd == JX9_TKWRD_CASE ){
			jx9_case_expr sCase;
			/* Standard case block */
			pGen->pIn++; /* Jump the 'case' keyword */
			/* initialize the structure */
			SySetInit(&sCase.aByteCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
			/* Compile the case expression */
			rc = GenStateCompileCaseExpr(pGen, &sCase);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			/* Compile the case block */
			rc = GenStateCompileSwitchBlock(pGen,&sCase.nStart);
			/* Insert in the switch container */
			SySetPut(&pSwitch->aCaseExpr, (const void *)&sCase);
			if( rc == SXERR_ABORT){
				return SXERR_ABORT;
			}else if( rc == SXERR_EOF ){
				break;
			}
		}else{
			/* Unexpected token */
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Switch: Unexpected token '%z'", 
				&pGen->pIn->sData);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			break;
		}
	}
	/* Fix all jumps now the destination is resolved */
	pSwitch->nOut = jx9VmInstrLength(pGen->pVm);
	GenStateFixJumps(pSwitchBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	if( pGen->pIn < pGen->pEnd ){
		/* Jump the trailing curly braces */
		pGen->pIn++;
	}
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}